

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reversed_tests.cpp
# Opt level: O1

void __thiscall
omp_reversed_reference_case_increase_values_Test::TestBody
          (omp_reversed_reference_case_increase_values_Test *this)

{
  _List_iterator<int> __tmp;
  _List_node_base *p_Var1;
  _List_iterator<int> __tmp_1;
  _List_node_base *p_Var2;
  pointer *__ptr;
  char *in_R9;
  pointer *__ptr_2;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  AssertionResult gtest_ar_;
  list<int,_std::allocator<int>_> values;
  list<int,_std::allocator<int>_> expecting;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98;
  AssertHelper local_90;
  allocator_type local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  string local_78;
  _List_node_base local_50;
  _List_node_base local_38;
  
  local_78._M_dataplus._M_p = (pointer)0x400000001;
  local_78._M_string_length = 0x200000003;
  local_78.field_2._M_allocated_capacity._0_4_ = 5;
  p_Var2 = &local_50;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_78;
  std::__cxx11::list<int,_std::allocator<int>_>::list
            ((list<int,_std::allocator<int>_> *)p_Var2,__l,(allocator_type *)&local_38);
  local_78._M_dataplus._M_p = (char *)0x300000006;
  local_78._M_string_length = 0x500000004;
  local_78.field_2._M_allocated_capacity._0_4_ = 2;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_78;
  std::__cxx11::list<int,_std::allocator<int>_>::list
            ((list<int,_std::allocator<int>_> *)&local_38,__l_00,local_88);
  while (p_Var2 != local_50._M_next) {
    p_Var2 = p_Var2->_M_prev;
    *(int *)&p_Var2[1]._M_next = *(int *)&p_Var2[1]._M_next + 1;
  }
  p_Var2 = &local_50;
  p_Var1 = local_38._M_next;
  if (local_38._M_next != &local_38 && p_Var2 != local_50._M_next) {
    do {
      p_Var2 = p_Var2->_M_prev;
      if (*(int *)&p_Var2[1]._M_next != *(int *)&p_Var1[1]._M_next) {
        local_88[0] = (allocator_type)0x0;
        goto LAB_0013063c;
      }
      p_Var1 = p_Var1->_M_next;
    } while ((p_Var2 != local_50._M_next) && (p_Var1 != &local_38));
  }
  local_88[0] = (allocator_type)(p_Var1 == &local_38 && p_Var2 == local_50._M_next);
LAB_0013063c:
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_88[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)local_88,
               (AssertionResult *)
               "std::equal(std::cbegin(reversed_values), std::cend(reversed_values), std::cbegin(expecting), std::cend(expecting))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/reversed_tests.cpp"
               ,0x44,local_78._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT44(local_78.field_2._M_allocated_capacity._4_4_,
                               local_78.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._M_head_impl + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  while (local_38._M_next != &local_38) {
    p_Var2 = (((_List_base<int,_std::allocator<int>_> *)&(local_38._M_next)->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(local_38._M_next,0x18);
    local_38._M_next = p_Var2;
  }
  while (local_50._M_next != &local_50) {
    p_Var2 = (((_List_base<int,_std::allocator<int>_> *)&(local_50._M_next)->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(local_50._M_next,0x18);
    local_50._M_next = p_Var2;
  }
  return;
}

Assistant:

TEST(omp_reversed, reference_case_increase_values) {
  std::list values = {1, 4, 3, 2, 5};

  auto reversed_values = omp::reversed(values);

  std::list expecting = {6, 3, 4, 5, 2};

  for (auto &v : reversed_values)
    ++v;

  ASSERT_TRUE(std::equal(std::cbegin(reversed_values),
                         std::cend(reversed_values), std::cbegin(expecting),
                         std::cend(expecting)));
}